

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

void envy_bios_print_xpio(envy_bios *bios,FILE *out,envy_bios_xpio *xpio,int idx,uint mask)

{
  uint8_t uVar1;
  envy_bios_gpio_entry *peVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  size_t sStack_40;
  
  if (xpio->offset == 0) {
    return;
  }
  if (xpio->valid == '\0') {
    fprintf((FILE *)out,"Failed to parse XPIO table at 0x%04x version %d.%d\n\n",(ulong)xpio->offset
            ,(ulong)(xpio->version >> 4),(ulong)(xpio->version & 0xf));
    return;
  }
  pcVar3 = find_enum(xpio_types,(uint)xpio->type);
  fprintf((FILE *)out,"XPIO table %d at 0x%04x version %d.%d",(ulong)(uint)idx,(ulong)xpio->offset,
          (ulong)(xpio->version >> 4),(ulong)(xpio->version & 0xf));
  fprintf((FILE *)out," type 0x%02x [%s]",(ulong)xpio->type,pcVar3);
  fprintf((FILE *)out," at 0x%02x defbus %d",(ulong)xpio->addr,(ulong)xpio->bus);
  if (xpio->unk02_0 != '\0') {
    fprintf((FILE *)out," unk02_0 %d");
  }
  if (xpio->unk02_5 != '\0') {
    fprintf((FILE *)out," unk02_5 %d");
  }
  fputc(10,(FILE *)out);
  envy_bios_dump_hex(bios,out,(uint)xpio->offset,(uint)xpio->hlen,mask);
  lVar5 = 0xf;
  uVar4 = 0;
  do {
    if (xpio->entriesnum <= uVar4) {
      fputc(10,(FILE *)out);
      return;
    }
    peVar2 = xpio->entries;
    if (((mask >> 0x1e & 1) != 0) || (peVar2->log[lVar5 + -0x11] != '\0')) {
      fprintf((FILE *)out,"XPIO %d:",uVar4 & 0xffffffff);
      fprintf((FILE *)out," line %d",(ulong)peVar2->log[lVar5 + -0x10]);
      if (peVar2->log[lVar5 + -0x11] == '\0') {
        fwrite(" UNUSED",7,1,(FILE *)out);
      }
      else {
        fprintf((FILE *)out," tag 0x%02x");
      }
      uVar1 = peVar2->log[lVar5 + -0xe];
      switch(peVar2->log[lVar5 + -0xf]) {
      case '\0':
        if (uVar1 != '\x01') break;
        pcVar3 = " OUT";
        sStack_40 = 4;
LAB_00255e4e:
        fwrite(pcVar3,sStack_40,1,(FILE *)out);
        goto LAB_00255e5a;
      case '\x01':
        if (uVar1 == '\0') {
          pcVar3 = " OUT NEG";
          sStack_40 = 8;
          goto LAB_00255e4e;
        }
        break;
      case '\x02':
        if (uVar1 == '\x03') {
          pcVar3 = " IN";
          sStack_40 = 3;
          goto LAB_00255e4e;
        }
        break;
      case '\x03':
        if (uVar1 == '\x02') {
          pcVar3 = " IN NEG";
          sStack_40 = 7;
          goto LAB_00255e4e;
        }
      }
      fprintf((FILE *)out," LOG %d/%d");
LAB_00255e5a:
      if (0x3f < (bios->gpio).version) {
        fprintf((FILE *)out," DEF %d",(ulong)peVar2->log[lVar5 + -10]);
      }
      if (peVar2->log[lVar5 + -9] != '\0') {
        fprintf((FILE *)out," SPEC %d [???]");
      }
      if (peVar2->log[lVar5 + -0xd] != '\0') {
        fwrite(" param 1",8,1,(FILE *)out);
      }
      if (peVar2->log[lVar5 + -0xc] != '\0') {
        fprintf((FILE *)out," unk40_0 %d");
      }
      if (peVar2->log[lVar5 + -0xb] != '\0') {
        fprintf((FILE *)out," unk40_2 0x%02x");
      }
      if (peVar2->log[lVar5 + -8] != '\0') {
        fprintf((FILE *)out," SPEC_OUT 0x%02x");
      }
      if (((bios->gpio).version == 'A') && (peVar2->log[lVar5 + -4] != '\x0f')) {
        fprintf((FILE *)out," lockpin %d");
      }
      if (peVar2->log[lVar5 + -7] != 0) {
        fprintf((FILE *)out," SPEC_IN 0x%02x",(ulong)(peVar2->log[lVar5 + -7] - 1));
      }
      if (peVar2->log[lVar5 + -6] != '\0') {
        fprintf((FILE *)out," gsync %d");
      }
      fputc(10,(FILE *)out);
    }
    envy_bios_dump_hex(bios,out,(uint)*(ushort *)(peVar2->log + lVar5 + -0x13),(uint)xpio->rlen,mask
                      );
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x12;
  } while( true );
}

Assistant:

void envy_bios_print_xpio (struct envy_bios *bios, FILE *out, struct envy_bios_xpio *xpio, int idx, unsigned mask) {
	if (!xpio->offset)
		return;
	if (!xpio->valid) {
		fprintf(out, "Failed to parse XPIO table at 0x%04x version %d.%d\n\n", xpio->offset, xpio->version >> 4, xpio->version & 0xf);
		return;
	}
	const char *typename = find_enum(xpio_types, xpio->type);
	fprintf(out, "XPIO table %d at 0x%04x version %d.%d", idx, xpio->offset, xpio->version >> 4, xpio->version & 0xf);
	fprintf(out, " type 0x%02x [%s]", xpio->type, typename);
	fprintf(out, " at 0x%02x defbus %d", xpio->addr, xpio->bus);
	if (xpio->unk02_0)
		fprintf(out, " unk02_0 %d", xpio->unk02_0);
	if (xpio->unk02_5)
		fprintf(out, " unk02_5 %d", xpio->unk02_5);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, xpio->offset, xpio->hlen, mask);
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		if (entry->tag || mask & ENVY_BIOS_PRINT_UNUSED) {
			fprintf(out, "XPIO %d:", i);
			fprintf(out, " line %d", entry->line);
			if (entry->tag)
				fprintf(out, " tag 0x%02x", entry->tag);
			else
				fprintf(out, " UNUSED");
			if (entry->log[0] == 0 && entry->log[1] == 1) {
				fprintf(out, " OUT");
			} else if (entry->log[0] == 1 && entry->log[1] == 0) {
				fprintf(out, " OUT NEG");
			} else if (entry->log[0] == 2 && entry->log[1] == 3) {
				fprintf(out, " IN");
			} else if (entry->log[0] == 3 && entry->log[1] == 2) {
				fprintf(out, " IN NEG");
			} else {
				fprintf(out, " LOG %d/%d", entry->log[0], entry->log[1]);
			}
			if (bios->gpio.version >= 0x40)
				fprintf(out, " DEF %d", entry->def);
			if (entry->mode)
				fprintf(out, " SPEC %d [???]", entry->mode);
			if (entry->param)
				fprintf(out, " param 1");
			if (entry->unk40_0)
				fprintf(out, " unk40_0 %d", entry->unk40_0);
			if (entry->unk40_2)
				fprintf(out, " unk40_2 0x%02x", entry->unk40_2);
			if (entry->spec_out)
				fprintf(out, " SPEC_OUT 0x%02x", entry->spec_out);
			if (bios->gpio.version == 0x41 && entry->lockpin != 15)
				fprintf(out, " lockpin %d", entry->lockpin);
			if (entry->spec_in)
				fprintf(out, " SPEC_IN 0x%02x", entry->spec_in-1);
			if (entry->gsync)
				fprintf(out, " gsync %d", entry->gsync);
			fprintf(out, "\n");
		}
		envy_bios_dump_hex(bios, out, entry->offset, xpio->rlen, mask);
	}
	fprintf(out, "\n");
}